

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::InternalSwap
          (BayesianProbitRegressor_FeatureWeight *this,BayesianProbitRegressor_FeatureWeight *other)

{
  uint32 uVar1;
  int iVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(other->weights_).super_RepeatedPtrFieldBase);
  uVar1 = this->featureid_;
  this->featureid_ = other->featureid_;
  other->featureid_ = uVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::InternalSwap(BayesianProbitRegressor_FeatureWeight* other) {
  weights_.InternalSwap(&other->weights_);
  std::swap(featureid_, other->featureid_);
  std::swap(_cached_size_, other->_cached_size_);
}